

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O0

void __thiscall CDirectiveConditional::writeTempData(CDirectiveConditional *this,TempData *tempData)

{
  bool bVar1;
  pointer pCVar2;
  TempData *tempData_local;
  CDirectiveConditional *this_local;
  
  if ((this->previousResult & 1U) == 0) {
    bVar1 = std::operator!=(&this->elseBlock,(nullptr_t)0x0);
    if (bVar1) {
      pCVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
               operator->(&this->elseBlock);
      CAssemblerCommand::applyFileInfo(pCVar2);
      pCVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
               operator->(&this->elseBlock);
      (*pCVar2->_vptr_CAssemblerCommand[4])(pCVar2,tempData);
    }
  }
  else {
    pCVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->ifBlock);
    CAssemblerCommand::applyFileInfo(pCVar2);
    pCVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->ifBlock);
    (*pCVar2->_vptr_CAssemblerCommand[4])(pCVar2,tempData);
  }
  return;
}

Assistant:

void CDirectiveConditional::writeTempData(TempData& tempData) const
{
	if (previousResult)
	{
		ifBlock->applyFileInfo();
		ifBlock->writeTempData(tempData);
	} else if (elseBlock != nullptr)
	{
		elseBlock->applyFileInfo();
		elseBlock->writeTempData(tempData);
	}
}